

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_cast_helper.hpp
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
chaiscript::detail::
Cast_Helper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::cast
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,Boxed_Value *ob,Type_Conversions_State *t_conversions)

{
  long *plVar1;
  
  plVar1 = (long *)verify_type<void>(ob,(type_info *)&std::__cxx11::string::typeinfo,
                                     ((ob->m_data).
                                      super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr)->m_const_data_ptr);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,*plVar1,plVar1[1] + *plVar1);
  return __return_storage_ptr__;
}

Assistant:

static decltype(auto) cast(const Boxed_Value &ob, const Type_Conversions_State *t_conversions) {
        return (Cast_Helper_Inner<T>::cast(ob, t_conversions));
      }